

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_b14c3b::RSTFormatter::Write(RSTFormatter *this,CStringRef s)

{
  Buffer<char> *pBVar1;
  size_t sVar2;
  char *__src;
  ulong uVar3;
  char *str;
  size_t __n;
  
  do {
    do {
      __src = s.data_;
      s.data_ = __src + 1;
    } while (*__src == ' ');
    __n = 0;
    while ((0x20 < (ulong)(byte)__src[__n] ||
           ((0x100000401U >> ((ulong)(byte)__src[__n] & 0x3f) & 1) == 0))) {
      __n = __n + 1;
    }
    if (0x4e < (long)((((long)this->pos_in_line_ + 1) - (ulong)((long)this->pos_in_line_ == 0)) +
                     __n)) {
      EndLine(this);
    }
    if (this->pos_in_line_ == 0) {
      Indent(this);
    }
    else {
      pBVar1 = this->writer_->buffer_;
      if (pBVar1->size_ == pBVar1->capacity_) {
        (**pBVar1->_vptr_Buffer)(pBVar1,pBVar1->size_ + 1);
      }
      sVar2 = pBVar1->size_;
      pBVar1->size_ = sVar2 + 1;
      pBVar1->ptr_[sVar2] = ' ';
      this->pos_in_line_ = this->pos_in_line_ + 1;
    }
    pBVar1 = this->writer_->buffer_;
    uVar3 = pBVar1->size_ + __n;
    if (pBVar1->capacity_ < uVar3) {
      (**pBVar1->_vptr_Buffer)(pBVar1,uVar3);
    }
    if (__n != 0) {
      memmove(pBVar1->ptr_ + pBVar1->size_,__src,__n);
    }
    pBVar1->size_ = uVar3;
    this->pos_in_line_ = this->pos_in_line_ + (int)__n;
    s.data_ = __src + __n;
    if (*s.data_ == '\n') {
      EndLine(this);
      s.data_ = __src + __n + 1;
    }
  } while (*s.data_ != '\0');
  return;
}

Assistant:

void RSTFormatter::Write(fmt::CStringRef s) {
  enum { MAX_LINE_LENGTH = 78 };
  const char *p = s.c_str();
  for (;;) {
    // Skip leading spaces.
    while (*p == ' ')
      ++p;
    const char *word_start = p;
    while (*p != ' ' && *p != '\n' && *p)
      ++p;
    const char *word_end = p;
    if (pos_in_line_ + (word_end - word_start) +
        (pos_in_line_ == 0 ? 0 : 1) > MAX_LINE_LENGTH) {
      EndLine();  // The word doesn't fit in the current line, start a new one.
    }
    if (pos_in_line_ == 0) {
      Indent();
    } else {
      // Separate words.
      writer_ << ' ';
      ++pos_in_line_;
    }
    std::size_t length = word_end - word_start;
    writer_ << fmt::StringRef(word_start, length);
    pos_in_line_ += static_cast<int>(length);
    if (*p == '\n') {
      EndLine();
      ++p;
    }
    if (!*p) break;
  }
}